

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenModulePrintAsmjs(BinaryenModuleRef module)

{
  __node_base_ptr *this;
  size_type *psVar1;
  undefined8 uVar2;
  Ref node;
  size_t sVar3;
  undefined1 reuse;
  char *pcVar4;
  string_view sVar5;
  Name funcName;
  undefined1 local_840 [8];
  Wasm2JSBuilder wasm2js;
  Output out;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_168;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined1 local_120 [8];
  JSPrinter jser;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [8];
  Wasm2JSGlue glue;
  Flags flags;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  flags._0_8_ = &flags.symbolsFile._M_string_length;
  glue.moduleName.super_IString.str._M_str._0_4_ = 0;
  glue.moduleName.super_IString.str._M_str._4_1_ = '\0';
  flags.symbolsFile._M_dataplus._M_p = (pointer)0x0;
  flags.symbolsFile._M_string_length._0_1_ = 0;
  jser.ast.inst._0_4_ = 0;
  jser.ast.inst._4_1_ = 0;
  local_e8[0] = &local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)local_e8,flags._0_8_);
  out._776_1_ = globalPassOptions.debug;
  out._777_1_ = globalPassOptions.validate;
  out._778_1_ = globalPassOptions.validateGlobally;
  out._779_1_ = globalPassOptions._3_1_;
  out._780_4_ = globalPassOptions.optimizeLevel;
  local_1a0._M_buckets = (__buckets_ptr)0x0;
  local_1a0._M_bucket_count = globalPassOptions.arguments._M_h._M_bucket_count;
  local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0._M_element_count = globalPassOptions.arguments._M_h._M_element_count;
  local_1a0._M_rehash_policy = globalPassOptions.arguments._M_h._M_rehash_policy;
  local_1a0._M_single_bucket = (__node_base_ptr)0x0;
  wasm2js.functionsCallableFromOutside._M_h._M_single_bucket = (__node_base_ptr)&local_1a0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_1a0,&globalPassOptions.arguments._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
              *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  local_168._M_buckets = (__buckets_ptr)0x0;
  local_168._M_bucket_count = globalPassOptions.passesToSkip._M_h._M_bucket_count;
  local_168._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_168._M_element_count = globalPassOptions.passesToSkip._M_h._M_element_count;
  local_168._M_rehash_policy = globalPassOptions.passesToSkip._M_h._M_rehash_policy;
  local_168._M_single_bucket = (__node_base_ptr)0x0;
  wasm2js.functionsCallableFromOutside._M_h._M_single_bucket = (__node_base_ptr)&local_168;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_168,&globalPassOptions.passesToSkip._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  local_130 = globalPassOptions.funcEffectsMap.
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_128 = globalPassOptions.funcEffectsMap.
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  if (globalPassOptions.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (globalPassOptions.funcEffectsMap.
       super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (globalPassOptions.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (globalPassOptions.funcEffectsMap.
       super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (globalPassOptions.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  wasm::Wasm2JSBuilder::Wasm2JSBuilder
            ((Wasm2JSBuilder *)local_840,(Flags *)&jser.ast,(PassOptions *)&out.field_0x308);
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_168);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a0);
  if (local_e8[0] != &local_d8) {
    operator_delete(local_e8[0],local_d8._M_allocated_capacity + 1);
  }
  funcName.super_IString.str._M_str = DAT_00da8820;
  funcName.super_IString.str._M_len = wasm::ASM_FUNC;
  pcVar4 = DAT_00da8820;
  node = wasm::Wasm2JSBuilder::processWasm((Wasm2JSBuilder *)local_840,module,funcName);
  reuse = SUB81(pcVar4,0);
  local_120[0] = true;
  local_120[1] = true;
  jser.pretty = false;
  jser.finalize = false;
  jser._2_6_ = 0;
  jser.buffer._0_5_ = 0;
  jser.buffer._5_3_ = 0;
  jser.size._0_5_ = 0;
  jser.size._5_3_ = 0;
  jser.used._0_5_ = 0;
  jser._32_8_ = node;
  local_c8 = (undefined1  [8])&glue.out;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  this = &wasm2js.functionsCallableFromOutside._M_h._M_single_bucket;
  wasm::Output::Output((Output *)this,(string *)local_c8,Text);
  if (local_c8 != (undefined1  [8])&glue.out) {
    operator_delete((void *)local_c8,CONCAT44(glue.out._4_4_,glue.out._0_4_) + 1);
  }
  flags.symbolsFile.field_2._8_4_ = glue.moduleName.super_IString.str._M_str._0_4_;
  flags.symbolsFile.field_2._M_local_buf[0xc] = glue.moduleName.super_IString.str._M_str._4_1_;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,flags._0_8_,flags.symbolsFile._M_dataplus._M_p + flags._0_8_);
  sVar5 = wasm::IString::interned((IString *)0x7,(string_view)ZEXT816(0xb47253),(bool)reuse);
  glue.out._0_4_ = flags.symbolsFile.field_2._8_4_;
  glue.out._4_1_ = flags.symbolsFile.field_2._M_local_buf[0xc];
  psVar1 = &glue.flags.symbolsFile._M_string_length;
  local_c8 = (undefined1  [8])module;
  glue.wasm = (Module *)this;
  glue.flags._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&glue.flags,local_50,local_48 + (long)local_50);
  glue._48_16_ = sVar5;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  wasm::Wasm2JSGlue::emitPre((Wasm2JSGlue *)local_c8);
  cashew::JSPrinter::print((JSPrinter *)local_120,node);
  cashew::JSPrinter::ensure((JSPrinter *)local_120,1);
  uVar2 = jser._0_8_;
  *(undefined1 *)(jser._0_8_ + CONCAT35(jser.size._5_3_,(undefined5)jser.size)) = 0;
  if (jser._0_8_ == 0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xdaa258);
  }
  else {
    sVar3 = strlen((char *)jser._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)uVar2,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  wasm::Wasm2JSGlue::emitPost((Wasm2JSGlue *)local_c8);
  if ((size_type *)glue.flags._0_8_ != psVar1) {
    operator_delete((void *)glue.flags._0_8_,glue.flags.symbolsFile._M_string_length + 1);
  }
  wasm::Output::~Output((Output *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  free((void *)jser._0_8_);
  wasm::Wasm2JSBuilder::~Wasm2JSBuilder((Wasm2JSBuilder *)local_840);
  if ((size_type *)flags._0_8_ != &flags.symbolsFile._M_string_length) {
    operator_delete((void *)flags._0_8_,
                    CONCAT71(flags.symbolsFile._M_string_length._1_7_,
                             (undefined1)flags.symbolsFile._M_string_length) + 1);
  }
  return;
}

Assistant:

void BinaryenModulePrintAsmjs(BinaryenModuleRef module) {
  auto* wasm = (Module*)module;
  Wasm2JSBuilder::Flags flags;
  Wasm2JSBuilder wasm2js(flags, globalPassOptions);
  auto asmjs = wasm2js.processWasm(wasm);
  JSPrinter jser(true, true, asmjs);
  Output out("", Flags::Text); // stdout
  Wasm2JSGlue glue(*wasm, out, flags, "asmFunc");
  glue.emitPre();
  jser.printAst();
  std::cout << jser.buffer << std::endl;
  glue.emitPost();
}